

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O2

void result_tests::ExpectResult<bilingual_str>
               (Result<bilingual_str> *result,bool success,bilingual_str *str)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  undefined ***pppuVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  char *local_100;
  char *local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  bool success_local;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x39;
  file.m_begin = (iterator)&local_90;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  success_local = success;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_a8 = "";
  pppuVar2 = &local_f0;
  local_f0 = (undefined **)
             CONCAT71(local_f0._1_7_,
                      *(__index_type *)
                       ((long)&(result->m_variant).super__Variant_base<bilingual_str,_bilingual_str>
                               .super__Move_assign_alias<bilingual_str,_bilingual_str>.
                               super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                               super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                               super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                               super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x40) ==
                      '\x01');
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_b0,0x39,1,2,pppuVar2,"bool(result)",&success_local,"success");
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3a;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = (iterator)pppuVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_011480b0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/result_tests.cpp";
  local_f8 = "";
  util::ErrorString<bilingual_str>((bilingual_str *)local_78,result);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
            (&local_f0,&local_100,0x3a,1,2,(bilingual_str *)local_78,"util::ErrorString(result)",str
             ,"str");
  bilingual_str::~bilingual_str((bilingual_str *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpectResult(const util::Result<T>& result, bool success, const bilingual_str& str)
{
    BOOST_CHECK_EQUAL(bool(result), success);
    BOOST_CHECK_EQUAL(util::ErrorString(result), str);
}